

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O3

bool udpdiscovery::Same(SamePeerMode mode,IpPort *lhv,IpPort *rhv)

{
  bool bVar1;
  
  if (mode == kSamePeerIpAndPort) {
    if (lhv->ip_ != rhv->ip_) {
      return false;
    }
    bVar1 = lhv->port_ == rhv->port_;
  }
  else {
    if (mode != kSamePeerIp) {
      return false;
    }
    bVar1 = lhv->ip_ == rhv->ip_;
  }
  return bVar1;
}

Assistant:

bool Same(PeerParameters::SamePeerMode mode, const IpPort& lhv,
          const IpPort& rhv) {
  switch (mode) {
    case PeerParameters::kSamePeerIp:
      return lhv.ip() == rhv.ip();

    case PeerParameters::kSamePeerIpAndPort:
      return (lhv.ip() == rhv.ip()) && (lhv.port() == rhv.port());
  }

  return false;
}